

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Num.cpp
# Opt level: O0

Num * __thiscall Num::createNumber(Num *__return_storage_ptr__,Num *this,Short k)

{
  result_type_conflict1 rVar1;
  int local_277c;
  int i;
  uniform_int_distribution<int> d2_1;
  uniform_int_distribution<int> d1;
  uniform_int_distribution<int> d2;
  string a;
  undefined1 local_2730 [8];
  mt19937 gen;
  random_device rd;
  Short k_local;
  Num *this_local;
  Num *number;
  
  std::random_device::random_device((random_device *)&gen._M_p);
  rVar1 = std::random_device::operator()((random_device *)&gen._M_p);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)local_2730,(ulong)rVar1);
  std::__cxx11::string::string((string *)&d2);
  if (k == 1) {
    std::uniform_int_distribution<int>::uniform_int_distribution(&d1,0,9);
    std::uniform_int_distribution<int>::operator()
              (&d1,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                    *)local_2730);
    std::__cxx11::string::push_back((char)&d2);
  }
  else {
    std::uniform_int_distribution<int>::uniform_int_distribution(&d2_1,1,9);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)&stack0xffffffffffffd888,0,9);
    for (local_277c = 0; local_277c < (int)(k - 1); local_277c = local_277c + 1) {
      std::uniform_int_distribution<int>::operator()
                (&d2_1,(mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)local_2730);
      std::__cxx11::string::push_back((char)&d2);
    }
    std::uniform_int_distribution<int>::operator()
              ((uniform_int_distribution<int> *)&stack0xffffffffffffd888,
               (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)local_2730);
    std::__cxx11::string::push_back((char)&d2);
  }
  Num(__return_storage_ptr__,(string *)&d2,k);
  std::__cxx11::string::~string((string *)&d2);
  std::random_device::~random_device((random_device *)&gen._M_p);
  return __return_storage_ptr__;
}

Assistant:

Num Num::createNumber(Short k)
{

    std::random_device rd;
    std::mt19937 gen(rd());
    std::string a;

    if (k == 1)
    {
        std::uniform_int_distribution<> d2(0, 9);
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    else
    {
        std::uniform_int_distribution<> d1(1, 9);
        std::uniform_int_distribution<> d2(0, 9);
        for (int i = 0; i < k - 1; ++i)
        {
            a.push_back(static_cast<char>(48 + d1(gen)));
        }
        a.push_back(static_cast<char>(48 + d2(gen)));
    }
    Num number(a, k);

    return number;
}